

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

void __thiscall JSONNode::JSONNode(JSONNode *this,char mytype)

{
  internalJSONNode *piVar1;
  size_t *psVar2;
  bool local_61;
  allocator local_49;
  json_string local_48;
  char local_11;
  JSONNode *pJStack_10;
  char mytype_local;
  JSONNode *this_local;
  
  local_11 = mytype;
  pJStack_10 = this;
  piVar1 = internalJSONNode::newInternal(mytype);
  this->internal = piVar1;
  local_61 = true;
  if ((((local_11 != '\0') && (local_61 = true, local_11 != '\x01')) &&
      (local_61 = true, local_11 != '\x02')) &&
     ((local_61 = true, local_11 != '\x03' && (local_61 = true, local_11 != '\x04')))) {
    local_61 = local_11 == '\x05';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"Not a proper JSON type",&local_49);
  JSONDebug::_JSON_ASSERT(local_61,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  psVar2 = getCtorCounter();
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

inline JSONNode::JSONNode(char mytype) json_nothrow : internal(internalJSONNode::newInternal(mytype)){
    JSON_ASSERT((mytype == JSON_NULL) ||
			 (mytype == JSON_STRING) ||
			 (mytype == JSON_NUMBER) ||
			 (mytype == JSON_BOOL) ||
			 (mytype == JSON_ARRAY) ||
			 (mytype == JSON_NODE), JSON_TEXT("Not a proper JSON type"));
    LIBJSON_CTOR;
}